

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O1

void BasicTests::print_tree(string *savefolder,Graph *g)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pcVar3;
  double dVar4;
  long *plVar5;
  FILE *__stream;
  long *plVar6;
  Edge *pEVar7;
  ulong uVar8;
  Vertex *this;
  string savename_e_aux;
  string savename_v_aux;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  FILE *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  double local_38;
  
  std::operator+(&local_88,"mkdir ",savefolder);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_98 = *plVar6;
    lStack_90 = plVar5[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar6;
    local_a8 = (long *)*plVar5;
  }
  local_a0 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  system((char *)local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_88,"mkdir ",savefolder);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_98 = *plVar6;
    lStack_90 = plVar5[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar6;
    local_a8 = (long *)*plVar5;
  }
  local_a0 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  system((char *)local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (savefolder->_M_dataplus)._M_p;
  local_a8 = &local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,pcVar3 + savefolder->_M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  pcVar3 = (savefolder->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar3,pcVar3 + savefolder->_M_string_length);
  local_40 = savefolder;
  std::__cxx11::string::append((char *)&local_88);
  __stream = fopen((char *)local_a8,"w");
  local_68 = fopen(local_88._M_dataplus._M_p,"w");
  this = g->verticesList;
  if (this != (Vertex *)0x0) {
    do {
      for (pEVar7 = this->edgesList; pEVar7 != (Edge *)0x0; pEVar7 = pEVar7->nextEdge) {
        if (pEVar7->closed == true) {
          fprintf(__stream,"%2d, %2d, %4.6f, %4.6f, %4.6f, %4.6f, %4.6f, %4.6f\n",
                  SUB84(pEVar7->activeLoss,0),pEVar7->activePowerFlow,pEVar7->reactiveLoss,
                  pEVar7->reactivePowerFlow,pEVar7->resistance,pEVar7->reactance,
                  (ulong)(uint)pEVar7->origin->id,(ulong)(uint)pEVar7->destiny->id);
        }
      }
      uVar2 = this->id;
      std::vector<Capacitor,_std::allocator<Capacitor>_>::vector
                ((vector<Capacitor,_std::allocator<Capacitor>_> *)&local_60,&this->capacitorsAlloc);
      uVar8 = local_60._M_string_length - (long)local_60._M_dataplus._M_p;
      local_38 = Vertex::getActivePower(this);
      dVar4 = Vertex::getReactivePower(this);
      fprintf(local_68,"%2d, %1d, %4.6f, %4.6f, %4.6f\n",SUB84(local_38,0),dVar4,this->voltage,
              (ulong)uVar2,(ulong)(uint)((int)(uVar8 >> 3) * -0x33333333));
      std::vector<Capacitor,_std::allocator<Capacitor>_>::~vector
                ((vector<Capacitor,_std::allocator<Capacitor>_> *)&local_60);
      this = this->nextVertex;
    } while (this != (Vertex *)0x0);
  }
  fclose(local_68);
  fclose(__stream);
  std::operator+(&local_60,"python3 printTree.py ",local_40);
  system(local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  return;
}

Assistant:

void BasicTests::print_tree(const string savefolder, Graph *g) {
    system(("mkdir " + savefolder + " -p").c_str());
    system(("mkdir " + savefolder + "/Originals -p").c_str());

    string savename_e_aux = savefolder + "/original_e_tree.csv";
    string savename_v_aux = savefolder + "/original_v_tree.csv";
    FILE *output_file_edges_aux = fopen((savename_e_aux).c_str(), "w");
    FILE *output_file_vertices_aux = fopen((savename_v_aux).c_str(), "w");

    for (Vertex *v_aux = g->get_verticesList(); v_aux != NULL; v_aux = v_aux->getNext()) {
        for (Edge *e = v_aux->getEdgesList(); e != NULL; e = e->getNext()) {
            if (e->isClosed())
                fprintf(output_file_edges_aux, "%2d, %2d, %4.6f, %4.6f, %4.6f, %4.6f, %4.6f, %4.6f\n",
                        e->getOrigin()->getID(), e->getDestiny()->getID(), e->getActiveLoss(), e->getActivePowerFlow(),
                        e->getReactiveLoss(), e->getReactivePowerFlow(), e->getResistance(), e->getReactance());
        }
        fprintf(output_file_vertices_aux, "%2d, %1d, %4.6f, %4.6f, %4.6f\n",
                v_aux->getID(), (int) v_aux->getCapacitors().size(), v_aux->getActivePower(), v_aux->getReactivePower(),
                v_aux->getVoltage());
    }
    fclose(output_file_vertices_aux);
    fclose(output_file_edges_aux);
    system(("python3 printTree.py " + savefolder).c_str()); // plota grafico da rede
}